

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlParserInputPtr xmlCtxtPopInput(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlParserInputPtr pxVar2;
  long lVar3;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    iVar1 = ctxt->inputNr;
    lVar3 = (long)iVar1;
    if (0 < lVar3) {
      ctxt->inputNr = iVar1 + -1;
      if (iVar1 == 1) {
        pxVar2 = (xmlParserInputPtr)0x0;
      }
      else {
        pxVar2 = ctxt->inputTab[lVar3 + -2];
      }
      ctxt->input = pxVar2;
      pxVar2 = ctxt->inputTab[lVar3 + -1];
      ctxt->inputTab[lVar3 + -1] = (xmlParserInputPtr)0x0;
      return pxVar2;
    }
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlCtxtPopInput(xmlParserCtxtPtr ctxt)
{
    xmlParserInputPtr ret;

    if (ctxt == NULL)
        return(NULL);
    if (ctxt->inputNr <= 0)
        return (NULL);
    ctxt->inputNr--;
    if (ctxt->inputNr > 0)
        ctxt->input = ctxt->inputTab[ctxt->inputNr - 1];
    else
        ctxt->input = NULL;
    ret = ctxt->inputTab[ctxt->inputNr];
    ctxt->inputTab[ctxt->inputNr] = NULL;
    return (ret);
}